

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O2

NeuralNetwork *
buildBasicNeuralNetworkModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,TensorAttributes *outTensorAttr,
          int numberOfLayers,bool areWeightsQuantized,bool isBiasQuantized)

{
  ulong uVar1;
  Rep *pRVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  NeuralNetwork *pNVar7;
  NeuralNetworkLayer *this;
  string *psVar8;
  InnerProductLayerParams *this_00;
  WeightParams *pWVar9;
  QuantizationParams *pQVar10;
  LinearQuantizationParams *pLVar11;
  undefined1 *puVar12;
  undefined8 *puVar13;
  int i;
  int iVar14;
  char *pcVar15;
  int __val;
  long lVar16;
  void **ppvVar17;
  bool bVar18;
  string input;
  string layerName;
  string output;
  string local_50;
  
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pFVar4->name_,inTensorAttr->name,puVar13);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  pAVar6->datatype_ = 0x10020;
  for (iVar14 = 0; iVar14 < inTensorAttr->dimension; iVar14 = iVar14 + 1) {
    CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,1);
  }
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pFVar4->name_,outTensorAttr->name,puVar13);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  pAVar6->datatype_ = 0x10020;
  for (iVar14 = 0; iVar14 < outTensorAttr->dimension; iVar14 = iVar14 + 1) {
    CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,1);
  }
  m->specificationversion_ = 4;
  pNVar7 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(m);
  __val = 0;
  iVar14 = 0;
  if (0 < numberOfLayers) {
    iVar14 = numberOfLayers;
  }
  while( true ) {
    bVar18 = iVar14 == 0;
    iVar14 = iVar14 + -1;
    if (bVar18) break;
    this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&pNVar7->layers_);
    std::__cxx11::to_string(&input,__val);
    std::operator+(&layerName,"inner_layer",&input);
    std::__cxx11::string::~string((string *)&input);
    std::__cxx11::to_string(&output,__val + -1);
    std::operator+(&input,"output",&output);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::to_string(&local_50,__val);
    std::operator+(&output,"output",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pcVar15 = "inner_layer";
    if (numberOfLayers != 1) {
      pcVar15 = (char *)layerName._M_dataplus;
    }
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar13 = (undefined8 *)*puVar13;
    }
    google::protobuf::internal::ArenaStringPtr::
    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&this->name_,pcVar15,puVar13);
    psVar8 = &input;
    if (__val == 0) {
      psVar8 = (string *)inTensorAttr;
    }
    CoreML::Specification::NeuralNetworkLayer::add_input(this,(psVar8->_M_dataplus)._M_p);
    psVar8 = &output;
    if (__val == numberOfLayers + -1) {
      psVar8 = (string *)outTensorAttr;
    }
    CoreML::Specification::NeuralNetworkLayer::add_output(this,(psVar8->_M_dataplus)._M_p);
    this_00 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_innerproduct(this);
    this_00->inputchannels_ = 1;
    this_00->outputchannels_ = 1;
    pWVar9 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_weights(this_00);
    if (areWeightsQuantized) {
      pQVar10 = CoreML::Specification::WeightParams::_internal_mutable_quantization(pWVar9);
      pQVar10->numberofbits_ = 1;
      pLVar11 = CoreML::Specification::QuantizationParams::_internal_mutable_linearquantization
                          (pQVar10);
      CoreML::Specification::LinearQuantizationParams::_internal_add_scale(pLVar11,1.0);
      CoreML::Specification::LinearQuantizationParams::_internal_add_bias(pLVar11,0.0);
      uVar1 = (pWVar9->super_MessageLite)._internal_metadata_.ptr_;
      puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        puVar13 = (undefined8 *)*puVar13;
      }
      google::protobuf::internal::ArenaStringPtr::
      Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                (&pWVar9->int8rawvalue_,"x01",puVar13);
    }
    else {
      CoreML::Specification::WeightParams::_internal_add_floatvalue(pWVar9,1.0);
    }
    this_00->hasbias_ = true;
    pWVar9 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_bias(this_00);
    if (isBiasQuantized) {
      pQVar10 = CoreML::Specification::WeightParams::_internal_mutable_quantization(pWVar9);
      pQVar10->numberofbits_ = 1;
      pLVar11 = CoreML::Specification::QuantizationParams::_internal_mutable_linearquantization
                          (pQVar10);
      CoreML::Specification::LinearQuantizationParams::_internal_add_scale(pLVar11,1.0);
      CoreML::Specification::LinearQuantizationParams::_internal_add_bias(pLVar11,0.0);
      uVar1 = (pWVar9->super_MessageLite)._internal_metadata_.ptr_;
      puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        puVar13 = (undefined8 *)*puVar13;
      }
      google::protobuf::internal::ArenaStringPtr::
      Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                (&pWVar9->int8rawvalue_,"x01",puVar13);
    }
    else {
      CoreML::Specification::WeightParams::_internal_add_floatvalue(pWVar9,1.0);
    }
    if (isUpdatable) {
      this->isupdatable_ = true;
      pWVar9 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_weights(this_00);
      pWVar9->isupdatable_ = true;
      pWVar9 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_bias(this_00);
      pWVar9->isupdatable_ = true;
    }
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&input);
    std::__cxx11::string::~string((string *)&layerName);
    __val = __val + 1;
  }
  if (isUpdatable) {
    m->isupdatable_ = true;
    puVar12 = (undefined1 *)m->description_;
    if ((ModelDescription *)puVar12 == (ModelDescription *)0x0) {
      puVar12 = CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar2 = (((ModelDescription *)puVar12)->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar17 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar17 = (void **)0x0;
    }
    iVar14 = (((ModelDescription *)puVar12)->input_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar16 = 0; (long)iVar14 * 8 != lVar16; lVar16 = lVar16 + 8) {
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&layerName,*(FeatureDescription **)((long)ppvVar17 + lVar16))
      ;
      pMVar3 = CoreML::Specification::Model::_internal_mutable_description(m);
      pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                         (&pMVar3->traininginput_);
      CoreML::Specification::FeatureDescription::CopyFrom(pFVar4,(FeatureDescription *)&layerName);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&layerName);
    }
  }
  return pNVar7;
}

Assistant:

Specification::NeuralNetwork* buildBasicNeuralNetworkModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, int numberOfLayers, bool areWeightsQuantized, bool isBiasQuantized) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorAttr->name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < outTensorAttr->dimension; i++) {
        outTensorShape->add_shape(1);
    }
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto neuralNet = m.mutable_neuralnetwork();
    
    for (int i = 0; i < numberOfLayers; i++) {
        auto layer = neuralNet->add_layers();
        
        std::string layerName = "inner_layer" + std::to_string(i);
        std::string input = "output" + std::to_string(i-1);
        std::string output = "output" + std::to_string(i);
        
        layer->set_name((numberOfLayers == 1) ? "inner_layer" : layerName.c_str());
        layer->add_input((i == 0) ? inTensorAttr->name : input.c_str());
        layer->add_output((i == numberOfLayers-1) ? outTensorAttr->name : output.c_str());
        
        Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
        innerProductParams->set_inputchannels(1);
        innerProductParams->set_outputchannels(1);

        // set weight
        auto* weights = innerProductParams->mutable_weights();
        if (areWeightsQuantized) {
            auto *quant_params = weights->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            weights->set_int8rawvalue("x01"); // this is [1]
        } else {
            weights->add_floatvalue(1.0);
        }

        // set bias
        innerProductParams->set_hasbias(true);
        auto* bias = innerProductParams->mutable_bias();
        if (isBiasQuantized) {
            auto *quant_params = bias->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            bias->set_int8rawvalue("x01"); // this is [1]
        } else {
            bias->add_floatvalue(1.0);
        }
        
        if (isUpdatable) {
            layer->set_isupdatable(true);
            innerProductParams->mutable_weights()->set_isupdatable(true);
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
    }
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
    }
    
    return neuralNet;
}